

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

int ncnn::binary_op_no_broadcast<ncnn::BinaryOp_x86_fma_functor::binary_op_mul>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  __m128 afVar8;
  __m128 _outp_1;
  __m128 _p1_1;
  __m128 _p_1;
  __m256 _outp;
  __m256 _p1;
  __m256 _p;
  int i;
  float *outptr;
  float *ptr1;
  float *ptr;
  int q;
  int size;
  int channels;
  binary_op_mul op;
  Mat *m_1;
  Mat *m;
  Mat *m_2;
  __m256 *in_stack_fffffffffffffb00;
  __m256 *in_stack_fffffffffffffb08;
  binary_op_mul *in_stack_fffffffffffffb10;
  float local_460 [2];
  float afStack_458 [2];
  float local_450 [2];
  float afStack_448 [2];
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  int local_3c4;
  undefined8 local_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined4 local_3a8;
  long local_3a0;
  undefined4 local_398;
  undefined4 local_394;
  undefined4 local_390;
  undefined4 local_38c;
  undefined4 local_388;
  undefined8 local_380;
  undefined1 (*local_378) [32];
  undefined8 local_370;
  undefined8 local_368;
  undefined8 local_360;
  undefined4 local_358;
  long local_350;
  undefined4 local_348;
  undefined4 local_344;
  undefined4 local_340;
  undefined4 local_33c;
  undefined4 local_338;
  undefined8 local_330;
  float *local_328;
  undefined8 local_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined4 local_308;
  long local_300;
  undefined4 local_2f8;
  undefined4 local_2f4;
  undefined4 local_2f0;
  undefined4 local_2ec;
  undefined4 local_2e8;
  undefined8 local_2e0;
  float *local_2d8;
  int local_2d0;
  int local_2cc;
  int local_2c8;
  binary_op_mul local_2c1 [9];
  long *local_2b8;
  long *local_2b0;
  long *local_2a8;
  undefined1 local_29d;
  int local_29c;
  undefined8 *local_290;
  undefined1 local_285;
  int local_284;
  undefined8 *local_278;
  undefined8 *local_270;
  undefined8 *local_268;
  undefined8 *local_250;
  undefined8 *local_248;
  undefined8 *local_240;
  undefined1 local_235;
  int local_234;
  undefined8 *local_228;
  undefined8 *local_218;
  float *local_210;
  float *local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 (*local_1c8) [32];
  float *local_1c0;
  float *local_1b8;
  undefined8 local_1b0;
  float afStack_1a8 [2];
  undefined1 (*local_1a0) [32];
  long local_198;
  undefined4 local_18c;
  long local_188;
  undefined1 (*local_180) [32];
  undefined4 local_174;
  int local_170;
  int local_16c;
  undefined8 *local_168;
  long local_160;
  undefined4 local_154;
  long local_150;
  float *local_148;
  undefined4 local_13c;
  int local_138;
  int local_134;
  undefined8 *local_130;
  long local_128;
  undefined4 local_11c;
  long local_118;
  float *local_110;
  undefined4 local_104;
  int local_100;
  int local_fc;
  undefined8 *local_f8;
  undefined4 local_ec;
  long local_e8;
  undefined4 local_dc;
  long local_d8;
  undefined4 local_cc;
  long local_c8;
  undefined8 *local_a8;
  undefined8 *local_98;
  undefined8 *local_88;
  
  local_2c8 = (int)in_RDI[7];
  local_2cc = *(int *)((long)in_RDI + 0x2c) * (int)in_RDI[6] * *(int *)((long)in_RDI + 0x34) *
              (int)in_RDI[3];
  local_2b8 = in_RDX;
  local_2b0 = in_RSI;
  local_2a8 = in_RDI;
  for (local_2d0 = 0; local_2d0 < local_2c8; local_2d0 = local_2d0 + 1) {
    local_278 = &local_320;
    local_134 = *(int *)((long)local_2a8 + 0x2c);
    local_138 = (int)local_2a8[6];
    local_13c = *(undefined4 *)((long)local_2a8 + 0x34);
    local_2d8 = (float *)(*local_2a8 + local_2a8[8] * (long)local_2d0 * local_2a8[2]);
    local_150 = local_2a8[2];
    local_154 = (undefined4)local_2a8[3];
    local_160 = local_2a8[4];
    local_130 = &local_320;
    local_d8 = (long)local_134 * (long)local_138 * local_150;
    local_268 = &local_320;
    local_250 = &local_320;
    local_290 = &local_370;
    local_fc = *(int *)((long)local_2b0 + 0x2c);
    local_100 = (int)local_2b0[6];
    local_104 = *(undefined4 *)((long)local_2b0 + 0x34);
    local_328 = (float *)(*local_2b0 + local_2b0[8] * (long)local_2d0 * local_2b0[2]);
    local_118 = local_2b0[2];
    local_11c = (undefined4)local_2b0[3];
    local_128 = local_2b0[4];
    local_f8 = &local_370;
    local_e8 = (long)local_fc * (long)local_100 * local_118;
    local_270 = &local_370;
    local_248 = &local_370;
    local_228 = &local_3c0;
    local_16c = *(int *)((long)local_2b8 + 0x2c);
    local_170 = (int)local_2b8[6];
    local_174 = *(undefined4 *)((long)local_2b8 + 0x34);
    local_378 = (undefined1 (*) [32])(*local_2b8 + local_2b8[8] * (long)local_2d0 * local_2b8[2]);
    local_188 = local_2b8[2];
    local_18c = (undefined4)local_2b8[3];
    local_198 = local_2b8[4];
    local_168 = &local_3c0;
    local_c8 = (long)local_16c * (long)local_170 * local_188;
    local_218 = &local_3c0;
    local_240 = &local_3c0;
    local_2e8 = 0;
    local_2ec = 0;
    local_2f0 = 0;
    local_2f4 = 0;
    local_308 = 0;
    local_310 = 0;
    local_318 = 0;
    local_320 = 0;
    local_338 = 0;
    local_33c = 0;
    local_340 = 0;
    local_344 = 0;
    local_358 = 0;
    local_360 = 0;
    local_368 = 0;
    local_370 = 0;
    local_cc = 0x10;
    local_dc = 0x10;
    local_ec = 0x10;
    local_234 = local_2d0;
    local_235 = 1;
    local_284 = local_2d0;
    local_285 = 1;
    local_29c = local_2d0;
    local_29d = 1;
    local_2e0 = 0;
    local_2f8 = 0;
    local_330 = 0;
    local_348 = 0;
    local_3c0 = 0;
    local_3b0 = 0;
    local_3a8 = 0;
    local_398 = 0;
    local_394 = 0;
    local_390 = 0;
    local_38c = 0;
    local_388 = 0;
    local_380 = 0;
    local_3b8 = 0;
    local_180 = local_378;
    local_148 = local_2d8;
    local_110 = local_328;
    local_a8 = local_240;
    local_98 = local_248;
    local_88 = local_250;
    local_3a0 = local_198;
    local_350 = local_128;
    local_300 = local_160;
    for (local_3c4 = 0; local_3c4 + 7 < local_2cc; local_3c4 = local_3c4 + 8) {
      local_208 = local_2d8;
      local_400 = *(undefined8 *)local_2d8;
      uStack_3f8 = *(undefined8 *)(local_2d8 + 2);
      uStack_3f0 = *(undefined8 *)(local_2d8 + 4);
      uStack_3e8 = *(undefined8 *)(local_2d8 + 6);
      local_210 = local_328;
      uVar5 = *(undefined8 *)local_328;
      uVar4 = *(undefined8 *)(local_328 + 2);
      uVar6 = *(undefined8 *)(local_328 + 4);
      uVar7 = *(undefined8 *)(local_328 + 6);
      local_420 = uVar5;
      uStack_418 = uVar4;
      uStack_410 = uVar6;
      uStack_408 = uVar7;
      BinaryOp_x86_fma_functor::binary_op_mul::func_pack8
                (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
      local_1c8 = local_378;
      auVar1._8_8_ = uVar4;
      auVar1._0_8_ = uVar5;
      auVar1._16_8_ = uVar6;
      auVar1._24_8_ = uVar7;
      *local_378 = auVar1;
      local_2d8 = local_2d8 + 8;
      local_328 = local_328 + 8;
      local_378 = local_378 + 1;
      local_440 = uVar5;
      uStack_438 = uVar4;
      uStack_430 = uVar6;
      uStack_428 = uVar7;
      local_200 = uVar5;
      uStack_1f8 = uVar4;
      uStack_1f0 = uVar6;
      uStack_1e8 = uVar7;
    }
    for (; local_3c4 + 3 < local_2cc; local_3c4 = local_3c4 + 4) {
      local_1b8 = local_2d8;
      local_450 = *(float (*) [2])local_2d8;
      afStack_448 = *(float (*) [2])(local_2d8 + 2);
      local_1c0 = local_328;
      local_460 = *(float (*) [2])local_328;
      uVar5 = *(undefined8 *)(local_328 + 2);
      afStack_458 = (float  [2])uVar5;
      afVar8 = BinaryOp_x86_fma_functor::binary_op_mul::func_pack4
                         (local_2c1,(__m128 *)local_450,(__m128 *)local_460);
      local_1b0 = afVar8._0_8_;
      local_1a0 = local_378;
      auVar2._8_4_ = (float)uVar5;
      auVar2._12_4_ = SUB84(uVar5,4);
      auVar2._0_8_ = local_1b0;
      *(undefined1 (*) [16])*local_378 = auVar2;
      local_2d8 = local_2d8 + 4;
      local_328 = local_328 + 4;
      local_378 = (undefined1 (*) [32])(*local_378 + 0x10);
      afStack_1a8 = (float  [2])uVar5;
    }
    for (; local_3c4 < local_2cc; local_3c4 = local_3c4 + 1) {
      fVar3 = BinaryOp_x86_fma_functor::binary_op_mul::func(local_2c1,local_2d8,local_328);
      *(float *)*local_378 = fVar3;
      local_2d8 = local_2d8 + 1;
      local_328 = local_328 + 1;
      local_378 = (undefined1 (*) [32])(*local_378 + 4);
    }
  }
  return 0;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}